

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frobtadsappcurses.cc
# Opt level: O0

bool getTermSize(uint *width,uint *height)

{
  int iVar1;
  uint *in_RSI;
  uint *in_RDI;
  winsize size;
  uint h;
  uint w;
  int res;
  ushort local_2c;
  ushort local_2a;
  undefined4 local_24;
  undefined4 local_20;
  undefined4 local_1c;
  uint *local_18;
  uint *local_10;
  bool local_1;
  
  local_1c = 0xffffffff;
  local_20 = 0;
  local_24 = 0;
  local_2c = 0;
  local_2a = 0;
  local_18 = in_RSI;
  local_10 = in_RDI;
  iVar1 = ioctl(0,0x5413,&local_2c);
  if (iVar1 < 0) {
    local_1 = false;
  }
  else if ((local_2a == 0) || (local_2c == 0)) {
    *local_10 = 0x50;
    *local_18 = 0x18;
    local_1 = true;
  }
  else {
    *local_10 = (uint)local_2a;
    *local_18 = (uint)local_2c;
    local_1 = true;
  }
  return local_1;
}

Assistant:

static bool
getTermSize( unsigned& width, unsigned& height )
{
    // If the system has support for the TIOCGWINSZ or TIOCGSIZE
    // ioctl, use it to obtain the terminal's dimensions.
    int res = -1;
    unsigned w = 0;
    unsigned h = 0;
#if HAVE_TIOCGWINSZ
    winsize size;
    size.ws_col = size.ws_row = 0;
    res = ioctl(0, TIOCGWINSZ, &size);
    w = size.ws_col;
    h = size.ws_row;
#elif HAVE_TIOCGSIZE
    ttysize size;
    size.ts_cols = size.ts_lines = 0;
    res = ioctl(0, TIOCGSIZE, &size);
    w = size.ts_cols;
    h = size.ts_lines;
#endif
    if (res < 0) {
        // The call failed.
        return false;
    }
    if (w == 0 or h == 0) {
        // Kernel doesn't seem to know the terminal's size.     
        // Assume 80x24.
        width = 80;
        height = 24;
        return true;
    }
    width = w;
    height = h;
    return true;
}